

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

Vec_Ptr_t * Aig_ManDfsReverse(Aig_Man_t *p)

{
  void *pvVar1;
  Vec_Ptr_t *vNodes;
  Aig_Obj_t *pObj;
  uint uVar2;
  int iVar3;
  
  Aig_ManIncrementTravId(p);
  for (iVar3 = 0; iVar3 < p->vCos->nSize; iVar3 = iVar3 + 1) {
    pvVar1 = Vec_PtrEntry(p->vCos,iVar3);
    *(int *)((long)pvVar1 + 0x20) = p->nTravIds;
  }
  vNodes = Vec_PtrAlloc(p->nObjs[6] + p->nObjs[5]);
  for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar3);
    if ((pObj != (Aig_Obj_t *)0x0) &&
       ((uVar2 = *(uint *)&pObj->field_0x18 & 7, uVar2 == 4 || (uVar2 - 5 < 2)))) {
      Aig_ManDfsReverse_rec(p,pObj,vNodes);
    }
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Aig_ManDfsReverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    // mark POs
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // go through the nodes
    vNodes = Vec_PtrAlloc( Aig_ManNodeNum(p) );
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) )
            Aig_ManDfsReverse_rec( p, pObj, vNodes );
    return vNodes;
}